

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

size_t anon_unknown.dwarf_82a252::cmWriteToMemoryCallback
                 (void *ptr,size_t size,size_t nmemb,void *data)

{
  size_t sVar1;
  
  sVar1 = (size_t)((int)size * (int)nmemb);
  std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
            ((vector<char,std::allocator<char>> *)data,*(undefined8 *)((long)data + 8),ptr,
             (long)ptr + sVar1);
  return sVar1;
}

Assistant:

size_t
  cmWriteToMemoryCallback(void *ptr, size_t size, size_t nmemb,
                          void *data)
    {
    int realsize = (int)(size * nmemb);
    cmFileCommandVectorOfChar *vec
      = static_cast<cmFileCommandVectorOfChar*>(data);
    const char* chPtr = static_cast<char*>(ptr);
    vec->insert(vec->end(), chPtr, chPtr + realsize);
    return realsize;
    }